

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O3

void __thiscall spv::Builder::addLine(Builder *this,Id fileName,int lineNum,int column)

{
  Vector<Id> *this_00;
  Block *pBVar1;
  Instruction *instruction;
  uint *puVar2;
  Instruction *raw_instruction;
  iterator iVar3;
  Id local_44;
  _Head_base<0UL,_spv::Instruction_*,_false> local_40;
  Builder *local_38;
  
  local_38 = this;
  instruction = (Instruction *)::dxil_spv::allocate_in_thread(0x38);
  instruction->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f31e0;
  instruction->resultId = 0;
  instruction->typeId = 0;
  instruction->opCode = OpLine;
  this_00 = &instruction->operands;
  (instruction->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (instruction->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (instruction->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  instruction->block = (Block *)0x0;
  local_44 = fileName;
  std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
  _M_realloc_insert<unsigned_int_const&>
            ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)this_00,
             (iterator)0x0,&local_44);
  iVar3._M_current =
       (instruction->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  puVar2 = (instruction->operands).
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  if (iVar3._M_current == puVar2) {
    local_44 = lineNum;
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)this_00,iVar3,
               &local_44);
    iVar3._M_current =
         (instruction->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    puVar2 = (instruction->operands).
             super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar3._M_current = lineNum;
    iVar3._M_current = iVar3._M_current + 1;
    (instruction->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  local_44 = column;
  if (iVar3._M_current == puVar2) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)this_00,iVar3,
               &local_44);
  }
  else {
    *iVar3._M_current = column;
    (instruction->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current + 1;
  }
  pBVar1 = local_38->buildPoint;
  local_40._M_head_impl = instruction;
  std::
  vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
  ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
            ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
              *)&pBVar1->instructions,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_40);
  instruction->block = pBVar1;
  if (instruction->resultId != 0) {
    Module::mapInstruction(pBVar1->parent->parent,instruction);
  }
  if (local_40._M_head_impl != (Instruction *)0x0) {
    (*(local_40._M_head_impl)->_vptr_Instruction[1])();
  }
  return;
}

Assistant:

void Builder::addLine(Id fileName, int lineNum, int column)
{
    Instruction* line = new Instruction(OpLine);
    line->addIdOperand(fileName);
    line->addImmediateOperand(lineNum);
    line->addImmediateOperand(column);
    buildPoint->addInstruction(std::unique_ptr<Instruction>(line));
}